

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl_interface.c
# Opt level: O1

c_int update_linsys_solver_rho_vec_qdldl(qdldl_solver *s,c_float *rho_vec)

{
  long m;
  c_float *pcVar1;
  csc *pcVar2;
  csc *pcVar3;
  ulong uVar4;
  long lVar5;
  
  m = s->m;
  if (0 < m) {
    pcVar1 = s->rho_inv_vec;
    lVar5 = 0;
    do {
      pcVar1[lVar5] = 1.0 / rho_vec[lVar5];
      lVar5 = lVar5 + 1;
    } while (m != lVar5);
  }
  update_KKT_param2(s->KKT,s->rho_inv_vec,s->rhotoKKT,m);
  pcVar2 = s->KKT;
  pcVar3 = s->L;
  uVar4 = QDLDL_factor(pcVar2->n,pcVar2->p,pcVar2->i,pcVar2->x,pcVar3->p,pcVar3->i,pcVar3->x,s->D,
                       s->Dinv,s->Lnz,s->etree,s->bwork,s->iwork,s->fwork);
  return uVar4 >> 0x3f;
}

Assistant:

c_int update_linsys_solver_rho_vec_qdldl(qdldl_solver * s, const c_float * rho_vec){
    c_int i;

    // Update internal rho_inv_vec
    for (i = 0; i < s->m; i++){
        s->rho_inv_vec[i] = 1. / rho_vec[i];
    }

    // Update KKT matrix with new rho_vec
    update_KKT_param2(s->KKT, s->rho_inv_vec, s->rhotoKKT, s->m);

    return (QDLDL_factor(s->KKT->n, s->KKT->p, s->KKT->i, s->KKT->x,
        s->L->p, s->L->i, s->L->x, s->D, s->Dinv, s->Lnz,
        s->etree, s->bwork, s->iwork, s->fwork) < 0);
}